

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O2

void __thiscall SM83::ld_hl_sp_d8(SM83 *this)

{
  uint uVar1;
  u8 uVar2;
  uint uVar3;
  undefined8 in_RAX;
  format_string<unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_signed_char_&>
  fmt;
  char *args_6;
  undefined7 uStack_18;
  s8 value;
  
  args_6 = (char *)0x10ce46;
  _uStack_18 = in_RAX;
  uVar2 = GetByteFromPC(this);
  fmt.str_.size_ = (size_t)this;
  fmt.str_.data_ = (char *)0x50;
  value = uVar2;
  ::fmt::v11::
  print<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,signed_char&>
            ((v11 *)
             "AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  LD HL, SP+0x{:02X}\n",fmt
             ,&(this->field_1).bc,&(this->field_2).de,&(this->field_3).hl,&this->sp,
             &this->pc_at_opcode,(unsigned_short *)&value,args_6);
  uVar1 = (int)value + (uint)this->sp;
  uVar3 = (uint)this->sp ^ (int)value ^ uVar1;
  (this->field_0).field_1.f =
       (byte)(uVar3 >> 4) & 0x10 | (this->field_0).field_1.f & 0xf | (char)uVar3 * '\x02' & 0x20U;
  (this->field_3).hl = (u16)uVar1;
  Timer::AdvanceCycles(this->timer,4);
  return;
}

Assistant:

void SM83::ld_hl_sp_d8() {
    s8 value = static_cast<s8>(GetByteFromPC());
    LTRACE("LD HL, SP+0x{:02X}", value);

    u32 result = sp + value;

    SetZeroFlag(false);
    SetNegateFlag(false);
    SetHalfCarryFlag(((sp ^ value ^ (result & 0xFFFF)) & 0x10) == 0x10);
    SetCarryFlag(((sp ^ value ^ (result & 0xFFFF)) & 0x100) == 0x100);

    hl = static_cast<u16>(result);

    timer.AdvanceCycles(4);
}